

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  int x;
  char *pcVar4;
  Error err;
  shared_ptr<fake::ErrLERandNum1> rerr;
  IError *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  x = -1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Handling ",9);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
    fake::MyFakeAPI::Call((MyFakeAPI *)&local_50,x);
    if (local_50 == (IError *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Nothing happened\n",0x11);
    }
    else {
      gerr::As<fake::ErrLERandNum1,gerr::details::IError,void>
                ((gerr *)&local_40,(shared_ptr<gerr::details::IError> *)&local_50);
      lVar3 = local_40;
      if (local_40 == 0) {
        bVar1 = gerr::Is<fake::ErrArgumentZero,gerr::details::IError,void>
                          ((shared_ptr<gerr::details::IError> *)&local_50);
        lVar3 = 0x1c;
        poVar2 = (ostream *)&std::cout;
        pcVar4 = "I don\'t care arg zero error\n";
        if (!bVar1) {
          bVar1 = gerr::IsCode<gerr::details::IError,void>
                            (0x7b,(shared_ptr<gerr::details::IError> *)&local_50);
          lVar3 = 0x1a;
          poVar2 = (ostream *)&std::cout;
          pcVar4 = "I don\'t care a dummy error";
          if (!bVar1) {
            poVar2 = gerr::details::operator<<((ostream *)&std::cerr,local_50);
            lVar3 = 1;
            pcVar4 = "\n";
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ErrLERandNum, rand val1:",0x18);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar3 + 0x28));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*(int *)(lVar3 + 0x2c));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    x = x + 1;
  } while (x != 5);
  return 0;
}

Assistant:

int main() {
  for (int i = -1; i < 5; i++) {
    std::cout << "Handling " << i << ":\n";
    auto const err = fake::MyFakeAPI::Call(i);
    if (err != nullptr) {
      auto const rerr = gerr::As<fake::ErrLERandNum1>(err);
      if (rerr != nullptr) {
        // 将通用错误转换为特定错误
        auto const &ctx = rerr->Context();
        std::cout << "ErrLERandNum, rand val1:" << ctx.randNum1 << ";"
                  << ctx.randNum2 << "\n";
      } else if (gerr::Is<fake::ErrArgumentZero>(err)) {
        // 检查一个错误是否是特定的错误，by type
        std::cout << "I don't care arg zero error\n";
      } else if (gerr::IsCode(123, err)) {
        // 检查一个错误是否是特定的错误，by error code
        std::cout << "I don't care a dummy error";
      } else {
        // 简单格式化错误链条并打印错误
        std::cerr << *err << "\n";
      }
    } else {
      std::cout << "Nothing happened\n";
    }
  }
  return 0;
}